

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O0

void create_default_conversion
               (FMField iofield,void *default_value,IOConversionPtr *conv_ptr_ptr,int conv_index)

{
  void *pvVar1;
  int in_EDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  IOConversionPtr conv_ptr;
  IOConversionPtr *s;
  void *in_stack_ffffffffffffffe0;
  
  s = &conv_ptr;
  pvVar1 = ffs_realloc(in_stack_ffffffffffffffe0,(size_t)s);
  *in_RSI = pvVar1;
  memset((void *)((long)pvVar1 + (long)in_EDX * 0x48 + 0x90),0,0x18);
  *(undefined8 *)((long)pvVar1 + (long)in_EDX * 0x48 + 0xd0) = 0;
  *(undefined8 *)((long)pvVar1 + (long)in_EDX * 0x48 + 0xa8) = 0;
  *(undefined4 *)((long)pvVar1 + (long)in_EDX * 0x48 + 0xb8) = *(undefined4 *)(s + 2);
  *(long *)((long)pvVar1 + (long)in_EDX * 0x48 + 0xb0) = (long)*(int *)((long)s + 0x14);
  *(undefined8 *)((long)pvVar1 + (long)in_EDX * 0x48 + 0xc0) = in_RDI;
  *(undefined4 *)((long)pvVar1 + (long)in_EDX * 0x48 + 200) = 0;
  return;
}

Assistant:

static void
create_default_conversion(FMField iofield, void *default_value, 
			  IOConversionPtr *conv_ptr_ptr, int conv_index)
{
    IOConversionPtr	conv_ptr =
	(IOConversionPtr) realloc(*conv_ptr_ptr, sizeof(IOConversionStruct) +
				  conv_index * sizeof(IOconvFieldStruct));
    *conv_ptr_ptr = conv_ptr;
    memset(&conv_ptr->conversions[conv_index].src_field, 0, 
	   sizeof(conv_ptr->conversions[conv_index].src_field));
    conv_ptr->conversions[conv_index].subconversion = NULL;
    conv_ptr->conversions[conv_index].iovar = NULL;
    conv_ptr->conversions[conv_index].dest_size = iofield.field_size;
    conv_ptr->conversions[conv_index].dest_offset = iofield.field_offset;
    conv_ptr->conversions[conv_index].default_value = default_value;
    conv_ptr->conversions[conv_index].rc_swap = no_row_column_swap;
}